

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_DataTranformPolarity(Cnf_Dat_t *pCnf,int fTransformPos)

{
  int iVar1;
  lit lVar2;
  void *__ptr;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int iVar;
  int i;
  int *pVarToPol;
  Aig_Obj_t *pObj;
  int fTransformPos_local;
  Cnf_Dat_t *pCnf_local;
  
  __ptr = calloc((long)pCnf->nVars,4);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pCnf->pMan->vObjs), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pCnf->pMan->vObjs,local_2c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (((fTransformPos != 0 || (iVar1 = Aig_ObjIsCo(pObj_00), iVar1 == 0)) &&
        (-1 < pCnf->pVarNums[pObj_00->Id])))) {
      *(uint *)((long)__ptr + (long)pCnf->pVarNums[pObj_00->Id] * 4) =
           (uint)(*(ulong *)&pObj_00->field_0x18 >> 3) & 1;
    }
  }
  local_2c = 0;
  while( true ) {
    if (pCnf->nLiterals <= local_2c) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return;
    }
    iVar1 = lit_var((*pCnf->pClauses)[local_2c]);
    if (pCnf->nVars <= iVar1) break;
    if (*(int *)((long)__ptr + (long)iVar1 * 4) != 0) {
      lVar2 = lit_neg((*pCnf->pClauses)[local_2c]);
      (*pCnf->pClauses)[local_2c] = lVar2;
    }
    local_2c = local_2c + 1;
  }
  __assert_fail("iVar < pCnf->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                ,0x29e,"void Cnf_DataTranformPolarity(Cnf_Dat_t *, int)");
}

Assistant:

void Cnf_DataTranformPolarity( Cnf_Dat_t * pCnf, int fTransformPos )
{
    Aig_Obj_t * pObj;
    int * pVarToPol;
    int i, iVar;
    // create map from the variable number to its polarity
    pVarToPol = ABC_CALLOC( int, pCnf->nVars );
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !fTransformPos && Aig_ObjIsCo(pObj) )
            continue;
        if ( pCnf->pVarNums[pObj->Id] >= 0 )
            pVarToPol[ pCnf->pVarNums[pObj->Id] ] = pObj->fPhase;
    }
    // transform literals
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        iVar = lit_var(pCnf->pClauses[0][i]);
        assert( iVar < pCnf->nVars );
        if ( pVarToPol[iVar] )
            pCnf->pClauses[0][i] = lit_neg( pCnf->pClauses[0][i] );
    }
    ABC_FREE( pVarToPol );
}